

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

void * qemu_map_ram_ptr_aarch64(uc_struct_conflict2 *uc,RAMBlock *ram_block,ram_addr_t addr)

{
  void *pvVar1;
  RAMBlock *local_28;
  RAMBlock *block;
  ram_addr_t addr_local;
  RAMBlock *ram_block_local;
  uc_struct_conflict2 *uc_local;
  
  local_28 = ram_block;
  block = (RAMBlock *)addr;
  if (ram_block == (RAMBlock *)0x0) {
    local_28 = qemu_get_ram_block(uc,addr);
    block = (RAMBlock *)(addr - local_28->offset);
  }
  pvVar1 = ramblock_ptr(local_28,(ram_addr_t)block);
  return pvVar1;
}

Assistant:

void *qemu_map_ram_ptr(struct uc_struct *uc, RAMBlock *ram_block, ram_addr_t addr)
{
    RAMBlock *block = ram_block;

    if (block == NULL) {
        block = qemu_get_ram_block(uc, addr);
        addr -= block->offset;
    }

    return ramblock_ptr(block, addr);
}